

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_div_s_h_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  ushort uVar4;
  
  uVar1 = *(ushort *)((env->active_fpu).fpr + ws);
  sVar2 = *(short *)((env->active_fpu).fpr + wt);
  uVar3 = 0x8000;
  uVar4 = 0x8000;
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar4 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar4 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((env->active_fpu).fpr + wd) = uVar4;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar3 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar3 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = uVar3;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  uVar3 = 0x8000;
  uVar4 = 0x8000;
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar4 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar4 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = uVar4;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar3 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar3 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = uVar3;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  uVar3 = 0x8000;
  uVar4 = 0x8000;
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar4 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar4 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar4;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar3 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar3 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = uVar3;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  uVar3 = 0x8000;
  uVar4 = 0x8000;
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar4 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar4 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = uVar4;
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  sVar2 = *(short *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  if (sVar2 != -1 || uVar1 != 0x8000) {
    if (sVar2 == 0) {
      uVar3 = (short)~uVar1 >> 0xf | 1;
    }
    else {
      uVar3 = (short)uVar1 / sVar2;
    }
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = uVar3;
  return;
}

Assistant:

void helper_msa_div_s_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_div_s_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_div_s_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_div_s_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_div_s_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_div_s_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_div_s_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_div_s_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_div_s_df(DF_HALF, pws->h[7],  pwt->h[7]);
}